

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__color_mask
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  byte bVar2;
  profile_GLES__technique__pass__color_mask__AttributeData *ppVar3;
  StringHash SVar4;
  long *in_RSI;
  ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  *in_RDI;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  profile_GLES__technique__pass__color_mask__AttributeData *attributeData;
  ParserChar *in_stack_00000078;
  ParserChar *in_stack_00000080;
  StringHash in_stack_00000088;
  ErrorType in_stack_00000090;
  Severity in_stack_00000094;
  ParserTemplateBase *in_stack_00000098;
  void **in_stack_ffffffffffffff98;
  ParserTemplateBase *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  ParserChar *elementHash;
  ParserTemplateBase *this_00;
  undefined8 *local_38;
  bool local_1;
  
  ppVar3 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::profile_GLES__technique__pass__color_mask__AttributeData>
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_0087ff24:
    if ((ppVar3->present_attributes & 1) == 0) {
      GeneratedSaxParser::XSList<bool>::XSList((XSList<bool> *)&stack0xffffffffffffff98);
      (ppVar3->value).data = (bool *)in_stack_ffffffffffffff98;
      (ppVar3->value).size = (size_t)in_stack_ffffffffffffffa0;
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          this_00 = (ParserTemplateBase *)*local_38;
          if (this_00 == (ParserTemplateBase *)0x0) goto LAB_0087ff24;
          SVar4 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)this_00);
          if (local_38 + 1 == (undefined8 *)0x0) {
            return false;
          }
          elementHash = (ParserChar *)local_38[1];
          local_38 = local_38 + 2;
          if (SVar4 != 0x76887d) break;
          ppVar3->param = elementHash;
        }
        if (SVar4 != 0x7c83b5) break;
        bVar1 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ::characterData2BoolList(in_RDI,(ParserChar *)0x7c83b5,(XSList<bool> *)0x87fe89);
        bVar2 = (bVar1 ^ 0xffU) & 1;
        if ((bVar2 != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)(SVar4 >> 0x20),(ErrorType)SVar4,
                               (StringHash)elementHash,
                               (CONCAT17(bVar1,in_stack_ffffffffffffffa8) ^ 0xff00000000000000) &
                               0x1ffffffffffffff,(ParserChar *)in_stack_ffffffffffffffa0), bVar1)) {
          return false;
        }
        if ((bVar2 & 1) == 0) {
          ppVar3->present_attributes = ppVar3->present_attributes | 1;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_00000098,in_stack_00000094,in_stack_00000090,in_stack_00000088,
                         in_stack_00000080,in_stack_00000078);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__color_mask( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__color_mask( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__color_mask__AttributeData* attributeData = newData<profile_GLES__technique__pass__color_mask__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2BoolList(attributeValue, attributeData->value, 0, HASH_ELEMENT_COLOR_MASK, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2BoolList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2BoolList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_COLOR_MASK,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__bool4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_COLOR_MASK,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__color_mask__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_COLOR_MASK,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_COLOR_MASK, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLES__technique__pass__color_mask__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    attributeData->value = GeneratedSaxParser::XSList<bool>();
}


    return true;
}